

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adopt.c
# Opt level: O2

lws * lws_adopt_socket_readbuf
                (lws_context *context,lws_sockfd_type accept_fd,char *readbuf,size_t len)

{
  lws *plVar1;
  
  plVar1 = lws_adopt_socket(context,accept_fd);
  plVar1 = adopt_socket_readbuf(plVar1,readbuf,len);
  return plVar1;
}

Assistant:

struct lws *
lws_adopt_socket_readbuf(struct lws_context *context, lws_sockfd_type accept_fd,
			 const char *readbuf, size_t len)
{
        return adopt_socket_readbuf(lws_adopt_socket(context, accept_fd),
				    readbuf, len);
}